

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall spvtools::opt::Loop::SetPreHeaderBlock(Loop *this,BasicBlock *preheader)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  BasicBlock *this_00;
  undefined1 local_28 [16];
  BasicBlock *local_18;
  BasicBlock *preheader_local;
  Loop *this_local;
  
  local_18 = preheader;
  if (preheader != (BasicBlock *)0x0) {
    preheader_local = (BasicBlock *)this;
    bVar1 = IsInsideLoop(this,preheader);
    if (bVar1) {
      __assert_fail("!IsInsideLoop(preheader) && \"The preheader block is in the loop\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x13e,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    BasicBlock::tail((BasicBlock *)(local_28 + 8));
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)(local_28 + 8));
    OVar2 = Instruction::opcode(pIVar5);
    if (OVar2 != OpBranch) {
      __assert_fail("preheader->tail()->opcode() == spv::Op::OpBranch && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x141,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    BasicBlock::tail((BasicBlock *)local_28);
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_28);
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
    this_00 = GetHeaderBlock(this);
    uVar4 = BasicBlock::id(this_00);
    if (uVar3 != uVar4) {
      __assert_fail("preheader->tail()->GetSingleWordOperand(0) == GetHeaderBlock()->id() && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x145,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
  }
  this->loop_preheader_ = local_18;
  return;
}

Assistant:

void Loop::SetPreHeaderBlock(BasicBlock* preheader) {
  if (preheader) {
    assert(!IsInsideLoop(preheader) && "The preheader block is in the loop");
    assert(preheader->tail()->opcode() == spv::Op::OpBranch &&
           "The preheader block does not unconditionally branch to the header "
           "block");
    assert(preheader->tail()->GetSingleWordOperand(0) ==
               GetHeaderBlock()->id() &&
           "The preheader block does not unconditionally branch to the header "
           "block");
  }
  loop_preheader_ = preheader;
}